

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

uint trad_enc_encrypt_update
               (trad_enc_ctx *ctx,uint8_t *in,size_t in_len,uint8_t *out,size_t out_len)

{
  byte c;
  byte bVar1;
  size_t local_48;
  uint uStack_34;
  uint8_t t;
  uint max;
  uint i;
  size_t out_len_local;
  uint8_t *out_local;
  size_t in_len_local;
  uint8_t *in_local;
  trad_enc_ctx *ctx_local;
  
  local_48 = out_len;
  if (in_len < out_len) {
    local_48 = in_len;
  }
  for (uStack_34 = 0; uStack_34 < (uint)local_48; uStack_34 = uStack_34 + 1) {
    c = in[uStack_34];
    bVar1 = trad_enc_decrypt_byte(ctx);
    out[uStack_34] = c ^ bVar1;
    trad_enc_update_keys(ctx,c);
  }
  return uStack_34;
}

Assistant:

static unsigned
trad_enc_encrypt_update(struct trad_enc_ctx *ctx, const uint8_t *in,
    size_t in_len, uint8_t *out, size_t out_len)
{
	unsigned i, max;

	max = (unsigned)((in_len < out_len)? in_len: out_len);

	for (i = 0; i < max; i++) {
		uint8_t t = in[i];
		out[i] = t ^ trad_enc_decrypt_byte(ctx);
		trad_enc_update_keys(ctx, t);
	}
	return i;
}